

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMove0<(moira::Instr)71,(moira::Mode)10,(moira::Size)1>(Moira *this,u16 opcode)

{
  u32 uVar1;
  byte bVar2;
  
  uVar1 = computeEA<(moira::Mode)10,(moira::Size)1,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)1,128ul>(this,uVar1);
  bVar2 = (byte)uVar1;
  (this->reg).sr.n = (bool)(bVar2 >> 7);
  (this->reg).sr.z = bVar2 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  *(byte *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58) = bVar2;
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  return;
}

Assistant:

void
Moira::execMove0(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M, S, STD_AE_FRAME> (src, ea, data)) return;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    if (!writeOp <MODE_DN, S> (dst, data)) return;

    prefetch<POLLIPL>();
}